

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::create_interface_instantiation(Generator *top)

{
  undefined1 local_58 [8];
  InterfaceInstantiationVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  InterfaceInstantiationVisitor::InterfaceInstantiationVisitor
            ((InterfaceInstantiationVisitor *)local_58);
  IRVisitor::visit_generator_root_tp
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  InterfaceInstantiationVisitor::~InterfaceInstantiationVisitor
            ((InterfaceInstantiationVisitor *)local_58);
  return;
}

Assistant:

void create_interface_instantiation(Generator* top) {
    InterfaceInstantiationVisitor visitor;
    visitor.visit_generator_root_tp(top);
}